

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

int __thiscall luna::Function::AddChildFunction(Function *this,Function *child)

{
  size_type sVar1;
  value_type *in_RDI;
  vector<luna::Function_*,_std::allocator<luna::Function_*>_> *unaff_retaddr;
  
  std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>::push_back(unaff_retaddr,in_RDI);
  sVar1 = std::vector<luna::Function_*,_std::allocator<luna::Function_*>_>::size
                    ((vector<luna::Function_*,_std::allocator<luna::Function_*>_> *)(in_RDI + 0xf));
  return (int)sVar1 + -1;
}

Assistant:

int Function::AddChildFunction(Function *child)
    {
        child_funcs_.push_back(child);
        return child_funcs_.size() - 1;
    }